

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int av1_rc_bits_per_mb(AV1_COMP *cpi,FRAME_TYPE frame_type,int qindex,double correction_factor,
                      int accurate_estimate)

{
  aom_bit_depth_t bit_depth;
  aom_rc_mode aVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  int iVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  bit_depth = ((cpi->common).seq_params)->bit_depth;
  bVar7 = (int)CONCAT71(in_register_00000031,frame_type) == 0;
  iVar5 = 750000;
  if (bVar7) {
    iVar5 = 1000000;
  }
  iVar6 = 1500000;
  if (bVar7) {
    iVar6 = 2000000;
  }
  if (cpi->is_screen_content_type != 0) {
    iVar6 = iVar5;
  }
  dVar8 = av1_convert_qindex_to_q(qindex,bit_depth);
  aVar1 = (cpi->oxcf).rc_cfg.mode;
  if (((accurate_estimate != 0 && !bVar7) && aVar1 == AOM_CBR) &&
     (uVar3 = cpi->rec_sse, uVar3 != 0xffffffffffffffff)) {
    iVar5 = (cpi->common).mi_params.MBs;
    auVar10._8_4_ = (int)(uVar3 >> 0x20);
    auVar10._0_8_ = uVar3;
    auVar10._12_4_ = 0x45300000;
    dVar9 = (auVar10._8_8_ - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0);
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = (double)((int)dVar9 << 9) / (double)iVar5;
    iVar5 = (cpi->rc).bit_est_ratio;
    iVar6 = (int)(300000.0 / dVar9);
    if (iVar5 != 0) {
      iVar6 = iVar5;
    }
    iVar5 = (int)((double)iVar6 * dVar9);
    iVar6 = 20000;
    if (20000 < iVar5) {
      iVar6 = iVar5;
    }
    if (169999 < iVar6) {
      iVar6 = 170000;
    }
    goto LAB_0020da72;
  }
  if ((frame_type != '\0' || aVar1 != AOM_CBR) ||
     ((((bit_depth != AOM_BITS_8 || ((cpi->sf).rt_sf.rc_adjust_keyframe == 0)) ||
       ((cpi->oxcf).rc_cfg.max_intra_bitrate_pct == 0)) ||
      (((cpi->svc).spatial_layer_id != 0 ||
       (iVar5 = (cpi->rc).perc_spatial_flat_blocks, 0x46 < iVar5)))))) goto LAB_0020da72;
  iVar2 = (cpi->rc).last_encoded_size_keyframe;
  if ((iVar2 == 0) || ((cpi->rc).frames_since_scene_change < (cpi->rc).frames_since_key)) {
    uVar4 = (cpi->rc).frame_spatial_variance;
    if ((1000 < uVar4) || (iVar5 == 0 && 500 < uVar4)) {
LAB_0020dab5:
      iVar6 = iVar6 << 3;
      goto LAB_0020da72;
    }
    if (iVar5 < 10 && 500 < uVar4) {
LAB_0020dacf:
      iVar6 = iVar6 << 2;
      goto LAB_0020da72;
    }
    bVar7 = 400 < uVar4;
  }
  else {
    iVar5 = (cpi->rc).last_target_size_keyframe;
    if ((iVar2 != iVar5 * 4 && SBORROW4(iVar2,iVar5 * 4) == iVar2 + iVar5 * -4 < 0) &&
       (500 < (cpi->rc).frame_spatial_variance)) goto LAB_0020dab5;
    if ((iVar2 != iVar5 * 2 && SBORROW4(iVar2,iVar5 * 2) == iVar2 + iVar5 * -2 < 0) &&
       (200 < (cpi->rc).frame_spatial_variance)) goto LAB_0020dacf;
    bVar7 = iVar5 < iVar2;
  }
  iVar6 = iVar6 << bVar7;
LAB_0020da72:
  return (int)(((double)iVar6 * correction_factor) / dVar8);
}

Assistant:

int av1_rc_bits_per_mb(const AV1_COMP *cpi, FRAME_TYPE frame_type, int qindex,
                       double correction_factor, int accurate_estimate) {
  const AV1_COMMON *const cm = &cpi->common;
  const int is_screen_content_type = cpi->is_screen_content_type;
  const aom_bit_depth_t bit_depth = cm->seq_params->bit_depth;
  const double q = av1_convert_qindex_to_q(qindex, bit_depth);
  int enumerator = get_bpmb_enumerator(frame_type, is_screen_content_type);

  assert(correction_factor <= MAX_BPB_FACTOR &&
         correction_factor >= MIN_BPB_FACTOR);

  if (cpi->oxcf.rc_cfg.mode == AOM_CBR && frame_type != KEY_FRAME &&
      accurate_estimate && cpi->rec_sse != UINT64_MAX) {
    const int mbs = cm->mi_params.MBs;
    const double sse_sqrt =
        (double)((int)sqrt((double)(cpi->rec_sse)) << BPER_MB_NORMBITS) /
        (double)mbs;
    const int ratio = (cpi->rc.bit_est_ratio == 0) ? get_init_ratio(sse_sqrt)
                                                   : cpi->rc.bit_est_ratio;
    // Clamp the enumerator to lower the q fluctuations.
    enumerator = AOMMIN(AOMMAX((int)(ratio * sse_sqrt), 20000), 170000);
  } else if (cpi->oxcf.rc_cfg.mode == AOM_CBR && frame_type == KEY_FRAME &&
             cpi->sf.rt_sf.rc_adjust_keyframe && bit_depth == 8 &&
             cpi->oxcf.rc_cfg.max_intra_bitrate_pct > 0 &&
             cpi->svc.spatial_layer_id == 0) {
    enumerator = adjust_rtc_keyframe(&cpi->rc, enumerator);
  }
  // q based adjustment to baseline enumerator
  return (int)(enumerator * correction_factor / q);
}